

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

bool pbrt::RemapPixelCoords(Point2i *pp,Point2i resolution,WrapMode2D wrapMode)

{
  WrapMode WVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  WrapMode *pWVar9;
  uint uVar10;
  WrapMode local_20;
  WrapMode local_1c;
  
  local_20 = wrapMode.wrap.values[0];
  local_1c = wrapMode.wrap.values[1];
  uVar10 = resolution.super_Tuple2<pbrt::Point2,_int>.x;
  uVar6 = resolution.super_Tuple2<pbrt::Point2,_int>.y;
  if (wrapMode.wrap.values[0] != OctahedralSphere) {
    pWVar9 = &local_20;
    bVar3 = true;
    do {
      bVar2 = bVar3;
      iVar8 = (&(pp->super_Tuple2<pbrt::Point2,_int>).x)[(byte)~bVar2];
      uVar5 = uVar6;
      if (bVar2) {
        uVar5 = uVar10;
      }
      if (iVar8 < 0 || (int)uVar5 <= iVar8) {
        WVar1 = *pWVar9;
        if (WVar1 == Repeat) {
          iVar4 = (iVar8 % (int)uVar5 >> 0x1f & uVar5) + iVar8 % (int)uVar5;
        }
        else {
          if (WVar1 != Clamp) {
            if (WVar1 == Black) {
              return false;
            }
            LogFatal(Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h"
                     ,0x8f,"Unhandled WrapMode mode");
          }
          iVar4 = uVar5 - 1;
          if (iVar8 < (int)(uVar5 - 1)) {
            iVar4 = iVar8;
          }
          if (iVar8 < 0) {
            iVar4 = 0;
          }
        }
        (&(pp->super_Tuple2<pbrt::Point2,_int>).x)[(byte)~bVar2] = iVar4;
      }
      pWVar9 = &local_1c;
      bVar3 = false;
    } while (bVar2);
    return true;
  }
  if (wrapMode.wrap.values[1] != OctahedralSphere) {
    LogFatal<char_const(&)[47]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h"
               ,0x66,"Check failed: %s",
               (char (*) [47])"wrapMode.wrap[1] == WrapMode::OctahedralSphere");
  }
  uVar5 = (pp->super_Tuple2<pbrt::Point2,_int>).x;
  if ((int)uVar5 < 0) {
    uVar5 = -uVar5;
LAB_002c0633:
    (pp->super_Tuple2<pbrt::Point2,_int>).x = uVar5;
    uVar7 = ~(pp->super_Tuple2<pbrt::Point2,_int>).y + uVar6;
    (pp->super_Tuple2<pbrt::Point2,_int>).y = uVar7;
  }
  else {
    if ((int)uVar10 <= (int)uVar5) {
      uVar5 = ~uVar5 + uVar10 * 2;
      goto LAB_002c0633;
    }
    uVar7 = (pp->super_Tuple2<pbrt::Point2,_int>).y;
  }
  if ((int)uVar7 < 0) {
    iVar8 = -uVar7;
  }
  else {
    if ((int)uVar7 < (int)uVar6) goto LAB_002c065b;
    iVar8 = ~uVar7 + uVar6 * 2;
  }
  (pp->super_Tuple2<pbrt::Point2,_int>).x = ~uVar5 + uVar10;
  (pp->super_Tuple2<pbrt::Point2,_int>).y = iVar8;
LAB_002c065b:
  if (uVar10 == 1) {
    (pp->super_Tuple2<pbrt::Point2,_int>).x = 0;
  }
  if (uVar6 == 1) {
    (pp->super_Tuple2<pbrt::Point2,_int>).y = 0;
  }
  return true;
}

Assistant:

PBRT_CPU_GPU
inline bool RemapPixelCoords(Point2i *pp, Point2i resolution, WrapMode2D wrapMode) {
    Point2i &p = *pp;

    if (wrapMode.wrap[0] == WrapMode::OctahedralSphere) {
        CHECK(wrapMode.wrap[1] == WrapMode::OctahedralSphere);
        if (p[0] < 0) {
            p[0] = -p[0];                     // mirror across u = 0
            p[1] = resolution[1] - 1 - p[1];  // mirror across v = 0.5
        } else if (p[0] >= resolution[0]) {
            p[0] = 2 * resolution[0] - 1 - p[0];  // mirror across u = 1
            p[1] = resolution[1] - 1 - p[1];      // mirror across v = 0.5
        }

        if (p[1] < 0) {
            p[0] = resolution[0] - 1 - p[0];  // mirror across u = 0.5
            p[1] = -p[1];                     // mirror across v = 0;
        } else if (p[1] >= resolution[1]) {
            p[0] = resolution[0] - 1 - p[0];      // mirror across u = 0.5
            p[1] = 2 * resolution[1] - 1 - p[1];  // mirror across v = 1
        }

        // Bleh: things don't go as expected for 1x1 images.
        if (resolution[0] == 1)
            p[0] = 0;
        if (resolution[1] == 1)
            p[1] = 0;

        return true;
    }

    for (int c = 0; c < 2; ++c) {
        if (p[c] >= 0 && p[c] < resolution[c])
            // in bounds
            continue;

        switch (wrapMode.wrap[c]) {
        case WrapMode::Repeat:
            p[c] = Mod(p[c], resolution[c]);
            break;
        case WrapMode::Clamp:
            p[c] = Clamp(p[c], 0, resolution[c] - 1);
            break;
        case WrapMode::Black:
            return false;
        default:
            LOG_FATAL("Unhandled WrapMode mode");
        }
    }
    return true;
}